

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Image * read_png_file(char *filename)

{
  pointer puVar1;
  uint uVar2;
  reference pvVar3;
  size_type insize;
  ostream *poVar4;
  char *pcVar5;
  byte *pbVar6;
  int local_294;
  uint local_290;
  int i;
  int x;
  int y;
  string local_280 [36];
  uint local_25c;
  undefined1 local_258 [4];
  uint error;
  State state;
  Image *image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> png;
  char *filename_local;
  
  png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)filename;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image);
  filename_local = (char *)operator_new(0x50);
  Image::Image(filename_local);
  lodepng::State::State((State *)local_258);
  puVar1 = png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,(char *)puVar1,(allocator *)((long)&y + 3));
  uVar2 = lodepng::load_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image,
                             (string *)local_280);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)((long)&y + 3));
  local_25c = uVar2;
  if (uVar2 == 0) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image,0);
    insize = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image);
    local_25c = lodepng_inspect((uint *)filename_local,(uint *)((long)filename_local + 4),
                                (LodePNGState *)local_258,pvVar3,insize);
  }
  if (local_25c == 0) {
    if (state.super_LodePNGState.info_png.interlace_method == 3) {
      if (4 < (uint)state.super_LodePNGState.info_png._12_4_) {
        printf("[read_png_file] PNG bit depth > 4. Only the first 16 colours will be used.\n");
      }
      state.super_LodePNGState.encoder.text_compression = 3;
      state.super_LodePNGState.encoder._84_4_ = 8;
      if (local_25c == 0) {
        local_25c = lodepng::decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    ((long)filename_local + 0x38),(uint *)filename_local,
                                    (uint *)((long)filename_local + 4),(State *)local_258,
                                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image)
        ;
      }
      if (local_25c == 0) {
        for (i = 0; (uint)i < *(uint *)((long)filename_local + 4); i = i + 1) {
          for (local_290 = 0; local_290 < *(uint *)filename_local; local_290 = local_290 + 1) {
            pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                ((long)filename_local + 0x38),
                                (ulong)(local_290 + i * *(uint *)filename_local));
            if (0xf < *pbVar6) {
              pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  ((long)filename_local + 0x38),
                                  (ulong)(local_290 + i * *(uint *)filename_local));
              printf("Warning: color palette index[%d] used at pixel(%d,%d).\n",(ulong)*pbVar6,
                     (ulong)local_290,(ulong)(uint)i);
              pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  ((long)filename_local + 0x38),
                                  (ulong)(local_290 + i * *(uint *)filename_local));
              *pvVar3 = '\0';
            }
          }
        }
        for (local_294 = 0; local_294 < 0x10; local_294 = local_294 + 1) {
          if ((uchar *)(long)local_294 < state.super_LodePNGState.info_png.color.palette) {
            *(undefined1 *)((long)filename_local + (long)local_294 * 3 + 8) =
                 *(undefined1 *)
                  (state.super_LodePNGState.info_png.color._0_8_ + (long)(local_294 << 2));
            *(undefined1 *)((long)filename_local + (long)local_294 * 3 + 9) =
                 *(undefined1 *)
                  (state.super_LodePNGState.info_png.color._0_8_ + (long)(local_294 * 4 + 1));
            *(undefined1 *)((long)filename_local + (long)local_294 * 3 + 10) =
                 *(undefined1 *)
                  (state.super_LodePNGState.info_png.color._0_8_ + (long)(local_294 * 4 + 2));
          }
          else {
            *(undefined1 *)((long)filename_local + (long)local_294 * 3 + 8) = 0;
            *(undefined1 *)((long)filename_local + (long)local_294 * 3 + 9) = 0;
            *(undefined1 *)((long)filename_local + (long)local_294 * 3 + 10) = 0;
          }
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"[read_png_file] decoder error ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_25c);
        poVar4 = std::operator<<(poVar4,": ");
        pcVar5 = lodepng_error_text(local_25c);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        if ((uint *)filename_local != (uint *)0x0) {
          Image::~Image(filename_local);
          operator_delete(filename_local);
        }
        filename_local = (char *)0x0;
      }
    }
    else {
      printf("[read_png_file] Only indexed PNG files allowed\n");
      if ((uint *)filename_local != (uint *)0x0) {
        Image::~Image(filename_local);
        operator_delete(filename_local);
      }
      filename_local = (char *)0x0;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"[read_png_file] error reading file ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_25c);
    poVar4 = std::operator<<(poVar4,": ");
    pcVar5 = lodepng_error_text(local_25c);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    if ((uint *)filename_local != (uint *)0x0) {
      Image::~Image(filename_local);
      operator_delete(filename_local);
    }
    filename_local = (char *)0x0;
  }
  lodepng::State::~State((State *)local_258);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image);
  return (Image *)filename_local;
}

Assistant:

Image *read_png_file(const char *filename) {
    std::vector<unsigned char> png;
    Image *image = new Image;
    lodepng::State state;

    unsigned error = lodepng::load_file(png, filename);
    if (!error) error = lodepng_inspect(&image->width, &image->height, &state, &png[0], png.size());
    if (error) {
        std::cout << "[read_png_file] error reading file " << error << ": "<< lodepng_error_text(error) << std::endl;
        delete image;
        return nullptr;
    }

    if (state.info_png.color.colortype != LCT_PALETTE) {
        printf("[read_png_file] Only indexed PNG files allowed\n");
        delete image;
        return nullptr;
    }

    if (state.info_png.color.bitdepth > 4) {
        printf("[read_png_file] PNG bit depth > 4. Only the first 16 colours will be used.\n");
    }

    state.info_raw.colortype = LCT_PALETTE;
    state.info_raw.bitdepth = 8;


    if(!error) error = lodepng::decode(image->pixels, image->width, image->height, state, png);
    if (error) {
        std::cout << "[read_png_file] decoder error " << error << ": "<< lodepng_error_text(error) << std::endl;
        delete image;
        return nullptr;
    }

    // Remove all colors after the first 16 palette entries.
    for (int y = 0; y < image->height; y++) {
        for (int x = 0; x < image->width; x++) {
            if (image->pixels[x + y * image->width] >= MAX_COLOURS) {
                printf("Warning: color palette index[%d] used at pixel(%d,%d).\n", image->pixels[x + y * image->width], x, y);
                image->pixels[x + y * image->width] = 0;
            }
        }
    }

    for(int i = 0; i < MAX_COLOURS; i++) {
        if (i < state.info_png.color.palettesize) {
            image->palette[i].red = state.info_png.color.palette[i * 4];
            image->palette[i].green = state.info_png.color.palette[i * 4 + 1];
            image->palette[i].blue = state.info_png.color.palette[i * 4 + 2];
        } else {
            image->palette[i].red   = 0;
            image->palette[i].green = 0;
            image->palette[i].blue  = 0;
        }
    }
    return image;
}